

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

int __thiscall
xercesc_4_0::TraverseSchema::parseBlockSet
          (TraverseSchema *this,DOMElement *elem,int blockType,bool isRoot)

{
  bool bVar1;
  uint uVar2;
  XMLCh *str1;
  XMLCh *str1_00;
  undefined7 in_register_00000009;
  undefined1 *attName;
  XMLStringTokenizer tokenizer;
  
  if ((int)CONCAT71(in_register_00000009,isRoot) == 0) {
    attName = SchemaSymbols::fgATT_BLOCK;
  }
  else {
    attName = SchemaSymbols::fgATT_BLOCKDEFAULT;
  }
  str1 = getElementAttValue(this,elem,(XMLCh *)attName,UnKnown);
  if (str1 == (XMLCh *)0x0) {
    uVar2 = this->fSchemaInfo->fBlockDefault;
  }
  else {
    bVar1 = XMLString::equals(str1,(XMLCh *)SchemaSymbols::fgATTVAL_POUNDALL);
    if (bVar1) {
      uVar2 = 7;
    }
    else {
      XMLStringTokenizer::XMLStringTokenizer(&tokenizer,str1,this->fGrammarPoolMemoryManager);
      uVar2 = 0;
      while( true ) {
        bVar1 = XMLStringTokenizer::hasMoreTokens(&tokenizer);
        if (!bVar1) break;
        str1_00 = XMLStringTokenizer::nextToken(&tokenizer);
        bVar1 = XMLString::equals(str1_00,(XMLCh *)SchemaSymbols::fgATTVAL_SUBSTITUTION);
        if ((blockType == 0) && (bVar1)) {
          uVar2 = uVar2 | 1;
        }
        else {
          bVar1 = XMLString::equals(str1_00,(XMLCh *)SchemaSymbols::fgATTVAL_EXTENSION);
          if (bVar1) {
            uVar2 = uVar2 | 2;
          }
          else {
            bVar1 = XMLString::equals(str1_00,(XMLCh *)SchemaSymbols::fgATTVAL_RESTRICTION);
            if (bVar1) {
              uVar2 = uVar2 | 4;
            }
            else {
              reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x3f,str1,(XMLCh *)0x0,
                                (XMLCh *)0x0,(XMLCh *)0x0);
            }
          }
        }
      }
      XMLStringTokenizer::~XMLStringTokenizer(&tokenizer);
    }
  }
  return uVar2;
}

Assistant:

int TraverseSchema::parseBlockSet(const DOMElement* const elem,
                                  const int blockType, const bool isRoot) {

    const XMLCh* blockVal = (isRoot) ? getElementAttValue(elem, SchemaSymbols::fgATT_BLOCKDEFAULT)
                                     : getElementAttValue(elem, SchemaSymbols::fgATT_BLOCK);

    // blockVal == 0 means 'block attribute is missing'; *blockVal == 0 means 'block="" found'
    if (blockVal == 0)
        return fSchemaInfo->getBlockDefault();

    int blockSet = 0;

    if (XMLString::equals(blockVal, SchemaSymbols::fgATTVAL_POUNDALL)) {

        blockSet = SchemaSymbols::XSD_EXTENSION + SchemaSymbols::XSD_RESTRICTION + SchemaSymbols::XSD_SUBSTITUTION;
        return blockSet;
    }

    XMLStringTokenizer tokenizer(blockVal, fGrammarPoolMemoryManager);

    while (tokenizer.hasMoreTokens()) {

        XMLCh* token = tokenizer.nextToken();

        if (XMLString::equals(token, SchemaSymbols::fgATTVAL_SUBSTITUTION)
            && blockType == ES_Block) {

            if ((blockSet & SchemaSymbols::XSD_SUBSTITUTION) == 0 ) {
                blockSet += SchemaSymbols::XSD_SUBSTITUTION;
            }
        }
        else if (XMLString::equals(token, SchemaSymbols::fgATTVAL_EXTENSION)) {

            if ((blockSet & SchemaSymbols::XSD_EXTENSION) == 0) {
                blockSet += SchemaSymbols::XSD_EXTENSION;
            }
        }
        else if (XMLString::equals(token, SchemaSymbols::fgATTVAL_RESTRICTION)) {

            if ((blockSet & SchemaSymbols::XSD_RESTRICTION) == 0 ) {
                blockSet += SchemaSymbols::XSD_RESTRICTION;
            }
        }
        else {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidBlockValue, blockVal);
        }
    } //end while

    return blockSet;
}